

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::BatchedMatMulLayerParams::MergePartialFromCodedStream
          (BatchedMatMulLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  short extraout_AX;
  short extraout_AX_00;
  short extraout_AX_01;
  short extraout_AX_02;
  short sVar4;
  uint32 uVar5;
  int iVar6;
  ulong extraout_RAX;
  WeightParams *pWVar7;
  ulong extraout_RAX_00;
  uint8 *puVar8;
  char cVar9;
  uint tag;
  ulong uVar10;
  pair<unsigned_long,_bool> pVar11;
  int local_68;
  int local_64;
  
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_00228491;
      input->buffer_ = pbVar2 + 1;
      uVar10 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_00228491:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar10 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar5 | uVar10;
    }
    tag = (uint)uVar10;
    if ((uVar10 & 0x100000000) == 0) goto switchD_00228501_caseD_3;
    cVar9 = (char)uVar10;
    switch((uint)(uVar10 >> 3) & 0x1fffffff) {
    case 1:
      MergePartialFromCodedStream();
      sVar4 = extraout_AX_00;
      goto LAB_00228684;
    case 2:
      MergePartialFromCodedStream();
      sVar4 = extraout_AX_02;
      goto LAB_00228684;
    case 5:
      if (cVar9 != '(') break;
      puVar8 = input->buffer_;
      if ((puVar8 < input->buffer_end_) && (-1 < (long)(char)*puVar8)) {
        this->weightmatrixfirstdimension_ = (long)(char)*puVar8;
        goto LAB_002285eb;
      }
      pVar11 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
      this->weightmatrixfirstdimension_ = pVar11.first;
LAB_00228610:
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_002284e1;
      goto LAB_002286a3;
    case 6:
      if (cVar9 != '0') break;
      puVar8 = input->buffer_;
      if ((input->buffer_end_ <= puVar8) || ((long)(char)*puVar8 < 0)) {
        pVar11 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        this->weightmatrixseconddimension_ = pVar11.first;
        goto LAB_00228610;
      }
      this->weightmatrixseconddimension_ = (long)(char)*puVar8;
LAB_002285eb:
      input->buffer_ = puVar8 + 1;
      goto LAB_002284e1;
    case 7:
      MergePartialFromCodedStream();
      sVar4 = extraout_AX;
LAB_00228684:
      if (sVar4 == 0) break;
      iVar6 = 6;
      if (sVar4 != 1) goto LAB_002284e1;
      goto LAB_002284e3;
    case 8:
      if (cVar9 != 'B') break;
      if (this->weights_ == (WeightParams *)0x0) {
        pWVar7 = (WeightParams *)operator_new(0x50);
        WeightParams::WeightParams(pWVar7);
        this->weights_ = pWVar7;
      }
      MergePartialFromCodedStream();
      iVar6 = local_64;
      uVar10 = extraout_RAX;
joined_r0x002285bd:
      if ((uVar10 & 1) == 0) goto LAB_002284e1;
      goto LAB_002284e3;
    case 9:
      if (cVar9 == 'J') {
        if (this->bias_ == (WeightParams *)0x0) {
          pWVar7 = (WeightParams *)operator_new(0x50);
          WeightParams::WeightParams(pWVar7);
          this->bias_ = pWVar7;
        }
        MergePartialFromCodedStream();
        iVar6 = local_68;
        uVar10 = extraout_RAX_00;
        goto joined_r0x002285bd;
      }
      break;
    case 10:
      MergePartialFromCodedStream();
      if (extraout_AX_01 == 1) goto LAB_002286a3;
      if (extraout_AX_01 != 0) goto LAB_002284e1;
    }
switchD_00228501_caseD_3:
    iVar6 = 7;
    if ((tag & 7) != 4 && tag != 0) {
      bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,tag);
      if (bVar3) {
LAB_002284e1:
        iVar6 = 0;
      }
      else {
LAB_002286a3:
        iVar6 = 6;
      }
    }
LAB_002284e3:
    if (iVar6 != 0) {
      return iVar6 != 6;
    }
  } while( true );
}

Assistant:

bool BatchedMatMulLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.BatchedMatMulLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // bool transposeA = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &transposea_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool transposeB = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &transposeb_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 weightMatrixFirstDimension = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &weightmatrixfirstdimension_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 weightMatrixSecondDimension = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &weightmatrixseconddimension_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool hasBias = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(56u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &hasbias_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams weights = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_weights()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams bias = 9;
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(74u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bias()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool int8DynamicQuantize = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &int8dynamicquantize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.BatchedMatMulLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.BatchedMatMulLayerParams)
  return false;
#undef DO_
}